

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O0

void __thiscall chatra::Reader::add(Reader *this,MethodTable *methodTable)

{
  Source SVar1;
  Node *local_20;
  MethodTable *local_18;
  MethodTable *methodTable_local;
  Reader *this_local;
  
  local_18 = methodTable;
  methodTable_local = (MethodTable *)this;
  SVar1 = MethodTable::getSource(methodTable);
  if (SVar1 == InnerFunctions) {
    local_20 = MethodTable::sourceNode(local_18);
    std::
    unordered_map<chatra::Node*,chatra::MethodTable_const*,std::hash<chatra::Node*>,std::equal_to<chatra::Node*>,std::allocator<std::pair<chatra::Node*const,chatra::MethodTable_const*>>>
    ::emplace<chatra::Node*,chatra::MethodTable_const*&>
              ((unordered_map<chatra::Node*,chatra::MethodTable_const*,std::hash<chatra::Node*>,std::equal_to<chatra::Node*>,std::allocator<std::pair<chatra::Node*const,chatra::MethodTable_const*>>>
                *)&this->nodeMethodTableMap,&local_20,&local_18);
  }
  MethodTable::forEach<chatra::Reader::add(chatra::MethodTable_const*)::__0>
            (local_18,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void Reader::add(const MethodTable* methodTable) {
	if (methodTable->getSource() == MethodTable::Source::InnerFunctions)
		nodeMethodTableMap.emplace(methodTable->sourceNode(), methodTable);
	methodTable->forEach([&](const Method& method) {
		add(&method);
	});
}